

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ConfigBlockSymbol::registerRules(ConfigBlockSymbol *this,InstanceOverride *node)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  ConfigRule *pCVar3;
  value_type_pointer ppVar4;
  int iVar5;
  undefined1 auVar6 [16];
  ulong pos0;
  uint uVar7;
  ulong hash;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  const_iterator __begin2;
  try_emplace_args_t local_79;
  flat_hash_map<const_syntax::SyntaxNode_*,_const_ConfigRule_*> *local_78;
  SyntaxNode *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  pCVar3 = node->rule;
  if (pCVar3 != (ConfigRule *)0x0) {
    local_78 = &this->ruleBySyntax;
    local_70 = (pCVar3->syntax).ptr;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_70;
    hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->ruleBySyntax).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar4 = (this->ruleBySyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
             .arrays.elements_;
    local_68 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.groups_size_mask;
    uVar8 = 0;
    uVar10 = pos0;
    do {
      pgVar1 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.groups_ + uVar10;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      uVar11 = (uchar)uVar2;
      auVar15[0] = -(local_48 == uVar11);
      uVar12 = (uchar)((uint)uVar2 >> 8);
      auVar15[1] = -(uStack_47 == uVar12);
      uVar13 = (uchar)((uint)uVar2 >> 0x10);
      auVar15[2] = -(uStack_46 == uVar13);
      bVar14 = (byte)((uint)uVar2 >> 0x18);
      auVar15[3] = -(bStack_45 == bVar14);
      auVar15[4] = -(uStack_44 == uVar11);
      auVar15[5] = -(uStack_43 == uVar12);
      auVar15[6] = -(uStack_42 == uVar13);
      auVar15[7] = -(bStack_41 == bVar14);
      auVar15[8] = -(uStack_40 == uVar11);
      auVar15[9] = -(uStack_3f == uVar12);
      auVar15[10] = -(uStack_3e == uVar13);
      auVar15[0xb] = -(bStack_3d == bVar14);
      auVar15[0xc] = -(uStack_3c == uVar11);
      auVar15[0xd] = -(uStack_3b == uVar12);
      auVar15[0xe] = -(uStack_3a == uVar13);
      auVar15[0xf] = -(bStack_39 == bVar14);
      for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); uVar7 != 0;
          uVar7 = uVar7 - 1 & uVar7) {
        iVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if (local_70 ==
            *(SyntaxNode **)((long)&ppVar4[uVar10 * 0xf].first + (ulong)(uint)(iVar5 << 4))) {
          local_50 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *
                     )((long)&ppVar4[uVar10 * 0xf].first + (ulong)(uint)(iVar5 << 4));
          goto LAB_003e5e58;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar9 = uVar10 + uVar8;
      uVar8 = uVar8 + 1;
      uVar10 = lVar9 + 1U & local_68;
    } while (uVar8 <= local_68);
    if ((this->ruleBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
        .size_ctrl.size <
        (this->ruleBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                  *)local_78,pos0,hash,&local_79,&local_70);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                  *)local_78,hash,&local_79,&local_70);
    }
LAB_003e5e58:
    local_50->second = pCVar3;
  }
  local_60 = (undefined1  [16])
             boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      *)node);
  while ((table_element_pointer)local_60._8_8_ != (table_element_pointer)0x0) {
    registerRules(this,&((table_element_pointer)local_60._8_8_)->second);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)local_60);
  }
  return;
}

Assistant:

void ConfigBlockSymbol::registerRules(const InstanceOverride& node) const {
    if (node.rule)
        ruleBySyntax[node.rule->syntax] = node.rule;

    for (auto& [_, child] : node.childNodes)
        registerRules(child);
}